

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall CConnman::Start(CConnman *this,CScheduler *scheduler,Options *connOptions)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *message;
  bool *this_00;
  int iVar1;
  int iVar2;
  CClientUIInterface *pCVar3;
  pointer pbVar4;
  pointer pbVar5;
  Function f;
  Function f_00;
  pointer pbVar6;
  bool bVar7;
  bool bVar8;
  Session *this_01;
  pointer pCVar9;
  pointer __p;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  char *fmt;
  unsigned_long *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  CConnman *local_1e8;
  undefined8 local_1e0;
  code *local_1d8;
  code *local_1d0;
  vector<CAddress,_std::allocator<CAddress>_> local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seed_nodes;
  string local_188;
  path local_160;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock83;
  undefined1 local_128 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [3];
  path local_b0;
  direct_or_indirect local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined2 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  Init(this,connOptions);
  if ((fListen == true) && (bVar7 = InitBinds(this,connOptions), !bVar7)) {
    pCVar3 = this->m_client_interface;
    if (pCVar3 != (CClientUIInterface *)0x0) {
      criticalblock83.super_unique_lock._M_device = (mutex_type *)local_128;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&criticalblock83,
                 "Failed to listen on any port. Use -listen=0 if you want this.","");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_128 + 0x10),
                   "Failed to listen on any port. Use -listen=0 if you want this.","");
      }
      else {
        local_88.indirect_contents.indirect =
             "Failed to listen on any port. Use -listen=0 if you want this.";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_128 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_88)
        ;
      }
      local_88.indirect_contents.indirect = (char *)&local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
      CClientUIInterface::ThreadSafeMessageBox
                (pCVar3,(bilingual_str *)&criticalblock83,(string *)&local_88,0x10000402);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.indirect_contents.indirect != &local_78) {
        operator_delete(local_88.indirect_contents.indirect,
                        CONCAT44(local_78._M_allocated_capacity._4_4_,
                                 local_78._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
        operator_delete(local_118[0]._M_dataplus._M_p,
                        (ulong)(local_118[0].field_2._M_allocated_capacity + 1));
      }
      if (criticalblock83.super_unique_lock._M_device != (mutex_type *)local_128) {
        operator_delete(criticalblock83.super_unique_lock._M_device,local_128._0_8_ + 1);
      }
    }
    bVar7 = false;
    goto LAB_008ce458;
  }
  CService::CService((CService *)&local_88);
  local_60._M_p = (pointer)&local_50;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40._0_1_ = false;
  local_40._1_1_ = false;
  bVar7 = GetProxy(NET_I2P,(Proxy *)&local_88);
  if ((bVar7) && (connOptions->m_i2p_accept_incoming == true)) {
    ArgsManager::GetDataDir((path *)&local_b0,&gArgs,true);
    std::filesystem::__cxx11::path::_M_append(&local_b0,0xf,"i2p_private_key");
    std::filesystem::__cxx11::path::path((path *)&criticalblock83,&local_b0);
    this_01 = (Session *)operator_new(0x118);
    i2p::sam::Session::Session
              (this_01,(path *)&criticalblock83,(Proxy *)&local_88,&this->interruptNet);
    local_188._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::reset
              ((__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
               &this->m_i2p_sam_session,this_01);
    std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
              ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)&local_188)
    ;
    std::filesystem::__cxx11::path::~path((path *)&criticalblock83);
    std::filesystem::__cxx11::path::~path(&local_b0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&seed_nodes,&connOptions->vSeedNodes);
  pbVar5 = seed_nodes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = seed_nodes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (seed_nodes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      seed_nodes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FastRandomContext::FastRandomContext((FastRandomContext *)&criticalblock83,false);
    std::
    shuffle<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,FastRandomContext>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pbVar4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )pbVar5,(FastRandomContext *)&criticalblock83);
    ChaCha20::~ChaCha20((ChaCha20 *)local_128);
  }
  if (this->m_use_addrman_outgoing == true) {
    ArgsManager::GetDataDir((path *)&local_160,&gArgs,true);
    std::filesystem::__cxx11::path::_M_append(&local_160,0xb,"anchors.dat");
    std::filesystem::__cxx11::path::path((path *)&criticalblock83,&local_160);
    ReadAnchors(&local_1c8,(path *)&criticalblock83);
    local_188.field_2._M_allocated_capacity =
         (size_type)
         (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_188._M_dataplus._M_p =
         (pointer)(this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_188._M_string_length =
         (size_type)
         (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_1c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_188);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_1c8);
    std::filesystem::__cxx11::path::~path((path *)&criticalblock83);
    fmt = (char *)0x8cda10;
    std::filesystem::__cxx11::path::~path(&local_160);
    criticalblock83.super_unique_lock._M_device =
         (mutex_type *)
         (((long)(this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
    if ((mutex_type *)0x2 < criticalblock83.super_unique_lock._M_device) {
      fmt = (char *)0x8cda47;
      std::vector<CAddress,_std::allocator<CAddress>_>::resize(&this->m_anchors,2);
      criticalblock83.super_unique_lock._M_device =
           (mutex_type *)
           (((long)(this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
    }
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x50;
    logging_function._M_str = "Start";
    logging_function._M_len = 5;
    LogPrintf_<unsigned_long>
              (logging_function,source_file,0xcd9,
               IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|RAND|REINDEX|RPC|ZMQ|BENCH|HTTP|MEMPOOL|TOR,
               (Level)(path *)&criticalblock83,fmt,in_stack_fffffffffffffde8);
  }
  pCVar3 = this->m_client_interface;
  if (pCVar3 != (CClientUIInterface *)0x0) {
    criticalblock83.super_unique_lock._M_device = (mutex_type *)local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&criticalblock83,anon_var_dwarf_2d4ab7d,anon_var_dwarf_2d4ab7d + 0x1b);
    message = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_128 + 0x10);
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)message,anon_var_dwarf_2d4ab7d,anon_var_dwarf_2d4ab7d + 0x1b);
    }
    else {
      local_188._M_dataplus._M_p = anon_var_dwarf_2d4ab7d;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (message,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_188);
    }
    CClientUIInterface::InitMessage(pCVar3,message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
      operator_delete(local_118[0]._M_dataplus._M_p,
                      (ulong)(local_118[0].field_2._M_allocated_capacity + 1));
    }
    if (criticalblock83.super_unique_lock._M_device != (mutex_type *)local_128) {
      operator_delete(criticalblock83.super_unique_lock._M_device,local_128._0_8_ + 1);
    }
  }
  this->fAddressesInitialized = true;
  if ((this->semOutbound)._M_t.super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>.
      _M_t.super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
      super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl == (CSemaphore *)0x0) {
    iVar1 = this->m_max_automatic_connections;
    iVar2 = this->m_max_automatic_outbound;
    pCVar9 = (pointer)operator_new(0x60);
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
    std::condition_variable::condition_variable((condition_variable *)pCVar9);
    (pCVar9->mutex).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    *(undefined8 *)((long)&(pCVar9->mutex).super___mutex_base._M_mutex + 0x10) = 0;
    (pCVar9->mutex).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    (pCVar9->mutex).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(pCVar9->mutex).super___mutex_base._M_mutex + 8) = 0;
    pCVar9->value = iVar2;
    criticalblock83.super_unique_lock._M_device = (mutex_type *)0x0;
    std::__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>::reset
              ((__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_> *)&this->semOutbound,
               pCVar9);
    std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::~unique_ptr
              ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)&criticalblock83);
  }
  if ((this->semAddnode)._M_t.super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>.
      _M_t.super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
      super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl == (CSemaphore *)0x0) {
    pCVar9 = (pointer)operator_new(0x60);
    iVar1 = this->m_max_addnode;
    std::condition_variable::condition_variable((condition_variable *)pCVar9);
    (pCVar9->mutex).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    *(undefined8 *)((long)&(pCVar9->mutex).super___mutex_base._M_mutex + 0x10) = 0;
    (pCVar9->mutex).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    (pCVar9->mutex).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(pCVar9->mutex).super___mutex_base._M_mutex + 8) = 0;
    pCVar9->value = iVar1;
    criticalblock83.super_unique_lock._M_device = (mutex_type *)0x0;
    std::__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>::reset
              ((__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_> *)&this->semAddnode,
               pCVar9);
    std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::~unique_ptr
              ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)&criticalblock83);
  }
  if (this->m_msgproc == (NetEventsInterface *)0x0) {
    __assert_fail("m_msgproc",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                  ,0xcee,"bool CConnman::Start(CScheduler &, const Options &)");
  }
  CThreadInterrupt::reset(&this->interruptNet);
  LOCK();
  (this->flagInterruptMsgProc)._M_base._M_i = false;
  UNLOCK();
  criticalblock83.super_unique_lock._M_device = &(this->mutexMsgProc).super_mutex;
  criticalblock83.super_unique_lock._8_8_ =
       criticalblock83.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::mutex>::lock(&criticalblock83.super_unique_lock);
  this->fMsgProcWake = false;
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock83.super_unique_lock);
  local_188._M_dataplus._M_p = (pointer)0x0;
  criticalblock83.super_unique_lock._M_device = (mutex_type *)operator_new(0x20);
  ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__align =
       (long)&PTR___State_013b60c8;
  *(CConnman **)
   ((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex + 8) = this;
  *(char **)((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex +
            0x10) = "net";
  ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__data.__list.__prev
       = (__pthread_internal_list *)util::TraceThread;
  std::thread::_M_start_thread(&local_188,&criticalblock83,0);
  if (criticalblock83.super_unique_lock._M_device != (mutex_type *)0x0) {
    (**(code **)(((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.
                 __align + 8))();
  }
  if ((this->threadSocketHandler)._M_id._M_thread != 0) {
    std::terminate();
  }
  (this->threadSocketHandler)._M_id._M_thread = (native_handle_type)local_188._M_dataplus._M_p;
  criticalblock83.super_unique_lock._M_device = (mutex_type *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&criticalblock83,"-dnsseed","");
  bVar7 = ArgsManager::GetBoolArg(&gArgs,(string *)&criticalblock83,true);
  if (criticalblock83.super_unique_lock._M_device != (mutex_type *)local_128) {
    operator_delete(criticalblock83.super_unique_lock._M_device,local_128._0_8_ + 1);
  }
  if (bVar7) {
    local_188._M_dataplus._M_p = (pointer)0x0;
    criticalblock83.super_unique_lock._M_device = (mutex_type *)operator_new(0x20);
    ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__align =
         (long)&PTR___State_013b6118;
    *(CConnman **)
     ((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex + 8) =
         this;
    *(char **)((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex +
              0x10) = "dnsseed";
    ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__data.__list.
    __prev = (__pthread_internal_list *)util::TraceThread;
    std::thread::_M_start_thread(&local_188,&criticalblock83,0);
    if (criticalblock83.super_unique_lock._M_device != (mutex_type *)0x0) {
      (**(code **)(((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.
                   __align + 8))();
    }
    if ((this->threadDNSAddressSeed)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->threadDNSAddressSeed)._M_id._M_thread = (native_handle_type)local_188._M_dataplus._M_p;
  }
  else {
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file_00._M_len = 0x50;
    logging_function_00._M_str = "Start";
    logging_function_00._M_len = 5;
    ::LogPrintf_<>(logging_function_00,source_file_00,0xcfb,ALL,Info,"DNS seeding disabled\n");
  }
  local_188._M_dataplus._M_p = (pointer)0x0;
  criticalblock83.super_unique_lock._M_device = (mutex_type *)operator_new(0x20);
  ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__align =
       (long)&PTR___State_013b6168;
  *(CConnman **)
   ((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex + 8) = this;
  *(char **)((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex +
            0x10) = "addcon";
  ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__data.__list.__prev
       = (__pthread_internal_list *)util::TraceThread;
  std::thread::_M_start_thread(&local_188,&criticalblock83,0);
  if (criticalblock83.super_unique_lock._M_device != (mutex_type *)0x0) {
    (**(code **)(((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.
                 __align + 8))();
  }
  if ((this->threadOpenAddedConnections)._M_id._M_thread != 0) {
    std::terminate();
  }
  (this->threadOpenAddedConnections)._M_id._M_thread =
       (native_handle_type)local_188._M_dataplus._M_p;
  pbVar4 = (connOptions->m_specified_outgoing).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (connOptions->m_specified_outgoing).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (connOptions->m_use_addrman_outgoing == true) {
    if (pbVar4 == pbVar5) {
LAB_008cdfaf:
      this_00 = &criticalblock83.super_unique_lock._M_owns;
      criticalblock83.super_unique_lock._M_device = (mutex_type *)this;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00,&connOptions->m_specified_outgoing);
      pbVar6 = seed_nodes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar5 = seed_nodes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = seed_nodes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_118[0]._M_dataplus._M_p =
           (pointer)seed_nodes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_118[0]._M_string_length =
           (size_type)
           seed_nodes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_118[0].field_2._M_allocated_capacity =
           seed_nodes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      seed_nodes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      seed_nodes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      seed_nodes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188._M_dataplus._M_p = (pointer)operator_new(0x50);
      *(undefined ***)local_188._M_dataplus._M_p = &PTR___State_impl_013b61b8;
      *(mutex_type **)((long)local_188._M_dataplus._M_p + 8) =
           criticalblock83.super_unique_lock._M_device;
      *(undefined8 *)((long)local_188._M_dataplus._M_p + 0x10) =
           criticalblock83.super_unique_lock._8_8_;
      *(undefined8 *)((long)local_188._M_dataplus._M_p + 0x18) = local_128._0_8_;
      *(undefined8 *)((long)local_188._M_dataplus._M_p + 0x20) = local_128._8_8_;
      local_128._8_8_ = 0;
      criticalblock83.super_unique_lock._M_owns = false;
      criticalblock83.super_unique_lock._9_7_ = 0;
      local_128._0_8_ = 0;
      *(pointer *)((long)local_188._M_dataplus._M_p + 0x28) = pbVar4;
      *(pointer *)((long)local_188._M_dataplus._M_p + 0x30) = pbVar5;
      *(pointer *)((long)local_188._M_dataplus._M_p + 0x38) = pbVar6;
      local_118[0].field_2._M_allocated_capacity = (__pthread_internal_list *)0x0;
      local_118[0]._M_dataplus._M_p = (pointer)0x0;
      local_118[0]._M_string_length = 0;
      *(char **)((long)local_188._M_dataplus._M_p + 0x40) = "opencon";
      *(code **)((long)local_188._M_dataplus._M_p + 0x48) = util::TraceThread;
      std::thread::_M_start_thread(&local_1c8,&local_188,0);
      if ((long *)local_188._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_188._M_dataplus._M_p + 8))();
      }
      if ((this->threadOpenConnections)._M_id._M_thread != 0) {
        std::terminate();
      }
      (this->threadOpenConnections)._M_id._M_thread =
           (native_handle_type)
           local_1c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_1c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_128 + 0x10));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
      goto LAB_008ce0cc;
    }
    pCVar3 = this->m_client_interface;
    if (pCVar3 != (CClientUIInterface *)0x0) {
      criticalblock83.super_unique_lock._M_device = (mutex_type *)local_128;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&criticalblock83,
                 "Cannot provide specific connections and have addrman find outgoing connections at the same time."
                 ,"");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_128 + 0x10),
                   "Cannot provide specific connections and have addrman find outgoing connections at the same time."
                   ,"");
      }
      else {
        local_188._M_dataplus._M_p =
             "Cannot provide specific connections and have addrman find outgoing connections at the same time."
        ;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_128 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_188
                  );
      }
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"");
      CClientUIInterface::ThreadSafeMessageBox
                (pCVar3,(bilingual_str *)&criticalblock83,&local_188,0x10000402);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,
                        (ulong)(local_188.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
        operator_delete(local_118[0]._M_dataplus._M_p,
                        (ulong)(local_118[0].field_2._M_allocated_capacity + 1));
      }
      if (criticalblock83.super_unique_lock._M_device != (mutex_type *)local_128) {
        operator_delete(criticalblock83.super_unique_lock._M_device,local_128._0_8_ + 1);
      }
    }
    bVar7 = false;
  }
  else {
    if (pbVar4 != pbVar5) goto LAB_008cdfaf;
LAB_008ce0cc:
    local_188._M_dataplus._M_p = (pointer)0x0;
    criticalblock83.super_unique_lock._M_device = (mutex_type *)operator_new(0x20);
    ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__align =
         (long)&PTR___State_013b6208;
    *(CConnman **)
     ((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex + 8) =
         this;
    *(char **)((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex +
              0x10) = "msghand";
    ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__data.__list.
    __prev = (__pthread_internal_list *)util::TraceThread;
    std::thread::_M_start_thread(&local_188,&criticalblock83,0);
    if (criticalblock83.super_unique_lock._M_device != (mutex_type *)0x0) {
      (**(code **)(((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.
                   __align + 8))();
    }
    if ((this->threadMessageHandler)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->threadMessageHandler)._M_id._M_thread = (native_handle_type)local_188._M_dataplus._M_p;
    if ((this->m_i2p_sam_session)._M_t.
        super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
        super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
        super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl != (Session *)0x0) {
      local_188._M_dataplus._M_p = (pointer)0x0;
      criticalblock83.super_unique_lock._M_device = (mutex_type *)operator_new(0x20);
      ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__align =
           (long)&PTR___State_013b6258;
      *(CConnman **)
       ((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex + 8) =
           this;
      *(char **)((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex
                + 0x10) = "i2paccept";
      ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__data.__list.
      __prev = (__pthread_internal_list *)util::TraceThread;
      std::thread::_M_start_thread(&local_188,&criticalblock83,0);
      if (criticalblock83.super_unique_lock._M_device != (mutex_type *)0x0) {
        (**(code **)(((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.
                     __align + 8))();
      }
      if ((this->threadI2PAcceptIncoming)._M_id._M_thread != 0) {
        std::terminate();
      }
      (this->threadI2PAcceptIncoming)._M_id._M_thread =
           (native_handle_type)local_188._M_dataplus._M_p;
    }
    local_1e0 = 0;
    local_1d0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp:3353:29)>
                ::_M_invoke;
    local_1d8 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp:3353:29)>
                ::_M_manager;
    f.super__Function_base._M_functor._8_8_ = scheduler;
    f.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffde8;
    f.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffdf8;
    f._M_invoker = (_Invoker_type)in_stack_fffffffffffffe00;
    local_1e8 = this;
    CScheduler::scheduleEvery(scheduler,f,(milliseconds)&local_1e8);
    if (local_1d8 != (code *)0x0) {
      (*local_1d8)(&local_1e8,&local_1e8,3);
    }
    bVar8 = NetGroupManager::UsingASMap(this->m_netgroupman);
    bVar7 = true;
    if (bVar8) {
      ASMapHealthCheck(this);
      f_00.super__Function_base._M_functor._8_8_ = scheduler;
      f_00.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffde8;
      f_00.super__Function_base._M_manager = (_Manager_type)this;
      f_00._M_invoker = (_Invoker_type)0x0;
      CScheduler::scheduleEvery(scheduler,f_00,(milliseconds)&stack0xfffffffffffffdf8);
      std::
      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp:3358:33)>
      ::_M_manager((_Any_data *)&stack0xfffffffffffffdf8,(_Any_data *)&stack0xfffffffffffffdf8,
                   __destroy_functor);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&seed_nodes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p,
                    CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]) + 1);
  }
  if (0x10 < (uint)local_78._M_allocated_capacity._0_4_) {
    free(local_88.indirect_contents.indirect);
  }
LAB_008ce458:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool CConnman::Start(CScheduler& scheduler, const Options& connOptions)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    Init(connOptions);

    if (fListen && !InitBinds(connOptions)) {
        if (m_client_interface) {
            m_client_interface->ThreadSafeMessageBox(
                _("Failed to listen on any port. Use -listen=0 if you want this."),
                "", CClientUIInterface::MSG_ERROR);
        }
        return false;
    }

    Proxy i2p_sam;
    if (GetProxy(NET_I2P, i2p_sam) && connOptions.m_i2p_accept_incoming) {
        m_i2p_sam_session = std::make_unique<i2p::sam::Session>(gArgs.GetDataDirNet() / "i2p_private_key",
                                                                i2p_sam, &interruptNet);
    }

    // Randomize the order in which we may query seednode to potentially prevent connecting to the same one every restart (and signal that we have restarted)
    std::vector<std::string> seed_nodes = connOptions.vSeedNodes;
    if (!seed_nodes.empty()) {
        std::shuffle(seed_nodes.begin(), seed_nodes.end(), FastRandomContext{});
    }

    if (m_use_addrman_outgoing) {
        // Load addresses from anchors.dat
        m_anchors = ReadAnchors(gArgs.GetDataDirNet() / ANCHORS_DATABASE_FILENAME);
        if (m_anchors.size() > MAX_BLOCK_RELAY_ONLY_ANCHORS) {
            m_anchors.resize(MAX_BLOCK_RELAY_ONLY_ANCHORS);
        }
        LogPrintf("%i block-relay-only anchors will be tried for connections.\n", m_anchors.size());
    }

    if (m_client_interface) {
        m_client_interface->InitMessage(_("Starting network threads…").translated);
    }

    fAddressesInitialized = true;

    if (semOutbound == nullptr) {
        // initialize semaphore
        semOutbound = std::make_unique<CSemaphore>(std::min(m_max_automatic_outbound, m_max_automatic_connections));
    }
    if (semAddnode == nullptr) {
        // initialize semaphore
        semAddnode = std::make_unique<CSemaphore>(m_max_addnode);
    }

    //
    // Start threads
    //
    assert(m_msgproc);
    interruptNet.reset();
    flagInterruptMsgProc = false;

    {
        LOCK(mutexMsgProc);
        fMsgProcWake = false;
    }

    // Send and receive from sockets, accept connections
    threadSocketHandler = std::thread(&util::TraceThread, "net", [this] { ThreadSocketHandler(); });

    if (!gArgs.GetBoolArg("-dnsseed", DEFAULT_DNSSEED))
        LogPrintf("DNS seeding disabled\n");
    else
        threadDNSAddressSeed = std::thread(&util::TraceThread, "dnsseed", [this] { ThreadDNSAddressSeed(); });

    // Initiate manual connections
    threadOpenAddedConnections = std::thread(&util::TraceThread, "addcon", [this] { ThreadOpenAddedConnections(); });

    if (connOptions.m_use_addrman_outgoing && !connOptions.m_specified_outgoing.empty()) {
        if (m_client_interface) {
            m_client_interface->ThreadSafeMessageBox(
                _("Cannot provide specific connections and have addrman find outgoing connections at the same time."),
                "", CClientUIInterface::MSG_ERROR);
        }
        return false;
    }
    if (connOptions.m_use_addrman_outgoing || !connOptions.m_specified_outgoing.empty()) {
        threadOpenConnections = std::thread(
            &util::TraceThread, "opencon",
            [this, connect = connOptions.m_specified_outgoing, seed_nodes = std::move(seed_nodes)] { ThreadOpenConnections(connect, seed_nodes); });
    }

    // Process messages
    threadMessageHandler = std::thread(&util::TraceThread, "msghand", [this] { ThreadMessageHandler(); });

    if (m_i2p_sam_session) {
        threadI2PAcceptIncoming =
            std::thread(&util::TraceThread, "i2paccept", [this] { ThreadI2PAcceptIncoming(); });
    }

    // Dump network addresses
    scheduler.scheduleEvery([this] { DumpAddresses(); }, DUMP_PEERS_INTERVAL);

    // Run the ASMap Health check once and then schedule it to run every 24h.
    if (m_netgroupman.UsingASMap()) {
        ASMapHealthCheck();
        scheduler.scheduleEvery([this] { ASMapHealthCheck(); }, ASMAP_HEALTH_CHECK_INTERVAL);
    }

    return true;
}